

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Papua.h
# Opt level: O0

void __thiscall Papua::Papua(Papua *this)

{
  Point<double> local_3e0;
  Point<double> local_3c8;
  Point<double> local_3b0;
  Point<double> local_398;
  Point<double> local_380;
  Point<double> local_368;
  Point<double> local_350;
  Point<double> local_338;
  Point<double> local_320;
  Point<double> local_308;
  Point<double> local_2f0;
  Point<double> local_2d8;
  Point<double> local_2c0;
  Point<double> local_2a8;
  Point<double> local_290;
  Point<double> local_278;
  Point<double> local_260;
  Point<double> local_248;
  Point<double> local_230;
  Point<double> local_218;
  Point<double> local_200;
  Point<double> local_1e8;
  Point<double> local_1d0;
  Point<double> local_1b8;
  Point<double> local_1a0;
  Point<double> local_188;
  Point<double> local_170;
  Point<double> local_158;
  Point<double> local_140;
  Point<double> local_128;
  Point<double> local_110;
  Point<double> local_f8;
  Point<double> local_e0;
  Point<double> local_c8;
  Point<double> local_b0;
  Point<double> local_98;
  Point<double> local_80;
  Point<double> local_68;
  Point<double> local_50;
  Point<double> local_28;
  Papua *local_10;
  Papua *this_local;
  
  local_10 = this;
  Polygon::Polygon(&this->super_Polygon);
  Point<double>::Point(&local_28,70.0,0.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_50,30.0,30.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_68,70.0,60.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_80,60.0,90.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_98,150.0,90.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_b0,165.0,120.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_c8,70.0,120.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_e0,85.0,150.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_f8,125.0,150.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_110,135.0,180.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_128,165.0,210.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_140,170.0,170.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_158,200.0,180.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_170,205.0,210.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_188,255.0,240.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_1a0,355.0,270.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_1b8,410.0,300.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_1d0,420.0,330.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_1e8,445.0,360.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_200,490.0,390.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_218,515.0,420.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_230,555.0,450.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_248,580.0,480.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_260,600.0,480.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_278,600.0,150.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_290,530.0,120.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_2a8,455.0,90.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_2c0,445.0,60.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_2d8,385.0,60.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_2f0,375.0,90.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_308,320.0,90.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_320,310.0,120.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_338,295.0,120.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_350,285.0,150.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_368,235.0,150.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_380,225.0,120.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_398,200.0,90.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_3b0,175.0,60.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_3c8,195.0,30.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_3e0,160.0,0.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  return;
}

Assistant:

Papua() {
    //Kiri
    addPoint(Point<double>(70, 0));
    //addPoint(Point<double>(70, 30));
    addPoint(Point<double>(30, 30));
    //addPoint(Point<double>(30, 60));
    addPoint(Point<double>(70, 60));
    addPoint(Point<double>(60, 90));
    addPoint(Point<double>(150, 90));
    addPoint(Point<double>(165, 120));
    addPoint(Point<double>(70, 120));
    addPoint(Point<double>(85, 150));
    addPoint(Point<double>(125, 150));
    //addPoint(Point<double>(125, 180));
    addPoint(Point<double>(135, 180));
    //addPoint(Point<double>(135, 210));
    //Lekukan bawah
    addPoint(Point<double>(165, 210));
    addPoint(Point<double>(170, 170));
    addPoint(Point<double>(200, 180));
    addPoint(Point<double>(205, 210));
    //Lekukan bawah
    //addPoint(Point<double>(255, 210));
    addPoint(Point<double>(255, 240));
    //addPoint(Point<double>(355, 240));
    addPoint(Point<double>(355, 270));
    //addPoint(Point<double>(410, 270));
    addPoint(Point<double>(410, 300));
    //addPoint(Point<double>(420, 300));
    addPoint(Point<double>(420, 330));
    //addPoint(Point<double>(445, 330));
    addPoint(Point<double>(445, 360));
    //addPoint(Point<double>(490, 360));
    addPoint(Point<double>(490, 390));
    //addPoint(Point<double>(515, 390));
    addPoint(Point<double>(515, 420));
    //addPoint(Point<double>(555, 420));
    addPoint(Point<double>(555, 450));
    //addPoint(Point<double>(580, 450));
    addPoint(Point<double>(580, 480));
    //Kanan
    addPoint(Point<double>(600, 480));
    addPoint(Point<double>(600, 150));
    //addPoint(Point<double>(600, 120));
    addPoint(Point<double>(530, 120));
    //addPoint(Point<double>(530, 90));
    addPoint(Point<double>(455, 90));
    addPoint(Point<double>(445, 60));
    //Lekukan Atas
    addPoint(Point<double>(385, 60));
    addPoint(Point<double>(375, 90));
    addPoint(Point<double>(320, 90));
    addPoint(Point<double>(310, 120));
    addPoint(Point<double>(295, 120));
    addPoint(Point<double>(285, 150));
    addPoint(Point<double>(235, 150));
    addPoint(Point<double>(225, 120));
    //addPoint(Point<double>(215, 120));
    addPoint(Point<double>(200, 90));
    //addPoint(Point<double>(190, 90));
    addPoint(Point<double>(175, 60));
    //lekukan Atas
    //addPoint(Point<double>(210, 60));
    addPoint(Point<double>(195, 30));
    //addPoint(Point<double>(160, 30));
    addPoint(Point<double>(160, 0));
  }